

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_CreateFromNamedFile
          (char *filename,ktxTextureCreateFlags createFlags,ktxTexture2 **newTex)

{
  void *__ptr;
  undefined8 *in_RDX;
  ktxTexture2 *tex;
  ktx_error_code_e result;
  ktxTextureCreateFlags in_stack_0000003c;
  char *in_stack_00000040;
  ktxTexture2 *in_stack_00000048;
  undefined4 local_4;
  
  if (in_RDX == (undefined8 *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    __ptr = malloc(0xa8);
    if (__ptr == (void *)0x0) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else {
      local_4 = ktxTexture2_constructFromNamedFile
                          (in_stack_00000048,in_stack_00000040,in_stack_0000003c);
      if (local_4 == KTX_SUCCESS) {
        *in_RDX = __ptr;
      }
      else {
        free(__ptr);
        *in_RDX = 0;
      }
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_CreateFromNamedFile(const char* const filename,
                                ktxTextureCreateFlags createFlags,
                                ktxTexture2** newTex)
{
    KTX_error_code result;

    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructFromNamedFile(tex, filename, createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture2*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}